

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fold_pclmulqdq_tpl.h
# Opt level: O2

void crc32_fold_pclmulqdq_copy(crc32_fold *crc,uint8_t *dst,uint8_t *src,size_t len)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar20;
  undefined1 (*pauVar21) [16];
  uint uVar22;
  uint uVar23;
  uint uVar24;
  __m128i xmm_crc_part;
  char partial_buf [16];
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  size_t local_e0;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  crc32_fold *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  longlong local_88;
  longlong lStack_80;
  ulong local_70;
  longlong local_68;
  longlong lStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar19;
  
  local_88 = 0;
  lStack_80 = 0;
  local_68 = 0;
  lStack_60 = 0;
  local_1e8 = *(ulong *)crc->fold;
  uStack_1e0 = *(ulong *)(crc->fold + 8);
  _local_1c8 = *(__m128i *)(crc->fold + 0x10);
  _local_1d8 = *(__m128i *)(crc->fold + 0x20);
  _local_1f8 = *(__m128i *)(crc->fold + 0x30);
  if (len < 0x10) {
    if (len == 0) {
      return;
    }
    memcpy(&local_68,src,len);
    local_88 = local_68;
    lStack_80 = lStack_60;
    memmove(dst,src,len);
  }
  else {
    uVar18 = -(int)src & 0xf;
    uVar19 = (ulong)uVar18;
    local_c0 = crc;
    if (uVar18 != 0) {
      local_88 = *(longlong *)src;
      lStack_80 = *(longlong *)(src + 8);
      *(longlong *)dst = local_88;
      *(longlong *)(dst + 8) = lStack_80;
      dst = dst + uVar19;
      partial_fold(uVar19,(__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,
                   (__m128i *)local_1f8,(__m128i *)&local_88);
      src = src + uVar19;
      len = len - uVar19;
    }
    lVar20 = 0;
    local_e0 = len;
    while (0x2bf < len) {
      puVar1 = (uint *)(src + lVar20);
      local_f8._0_4_ = *puVar1;
      local_f8._4_4_ = puVar1[1];
      uStack_f0._0_4_ = puVar1[2];
      uStack_f0._4_4_ = puVar1[3];
      puVar1 = (uint *)(src + lVar20 + 0x10);
      local_158._0_4_ = *puVar1;
      local_158._4_4_ = puVar1[1];
      uStack_150._0_4_ = puVar1[2];
      uStack_150._4_4_ = puVar1[3];
      local_148 = *(ulong *)(src + lVar20 + 0x20);
      uStack_140 = *(ulong *)(src + lVar20 + 0x20 + 8);
      local_198 = *(ulong *)(src + lVar20 + 0x30);
      uStack_190 = *(ulong *)(src + lVar20 + 0x30 + 8);
      local_168 = *(ulong *)(src + lVar20 + 0x40);
      uStack_160 = *(ulong *)((long)(src + lVar20 + 0x40) + 8);
      local_138 = *(ulong *)(src + lVar20 + 0x50);
      uStack_130 = *(ulong *)((long)(src + lVar20 + 0x50) + 8);
      puVar1 = (uint *)(src + lVar20 + 0x60);
      local_118._0_4_ = *puVar1;
      local_118._4_4_ = puVar1[1];
      uStack_110._0_4_ = puVar1[2];
      uStack_110._4_4_ = puVar1[3];
      puVar1 = (uint *)(src + lVar20 + 0x70);
      local_108._0_4_ = *puVar1;
      local_108._4_4_ = puVar1[1];
      uStack_100._0_4_ = puVar1[2];
      uStack_100._4_4_ = puVar1[3];
      puVar1 = (uint *)(dst + lVar20);
      *puVar1 = (uint)local_f8;
      puVar1[1] = local_f8._4_4_;
      puVar1[2] = (uint)uStack_f0;
      puVar1[3] = uStack_f0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x10);
      *puVar1 = (uint)local_158;
      puVar1[1] = local_158._4_4_;
      puVar1[2] = (uint)uStack_150;
      puVar1[3] = uStack_150._4_4_;
      *(ulong *)(dst + lVar20 + 0x20) = local_148;
      *(ulong *)(dst + lVar20 + 0x20 + 8) = uStack_140;
      *(ulong *)(dst + lVar20 + 0x30) = local_198;
      *(ulong *)(dst + lVar20 + 0x30 + 8) = uStack_190;
      *(ulong *)(dst + lVar20 + 0x40) = local_168;
      *(ulong *)((long)(dst + lVar20 + 0x40) + 8) = uStack_160;
      *(ulong *)(dst + lVar20 + 0x50) = local_138;
      *(ulong *)((long)(dst + lVar20 + 0x50) + 8) = uStack_130;
      puVar1 = (uint *)(dst + lVar20 + 0x60);
      *puVar1 = (uint)local_118;
      puVar1[1] = local_118._4_4_;
      puVar1[2] = (uint)uStack_110;
      puVar1[3] = uStack_110._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x70);
      *puVar1 = (uint)local_108;
      puVar1[1] = local_108._4_4_;
      puVar1[2] = (uint)uStack_100;
      puVar1[3] = uStack_100._4_4_;
      local_d8 = (uint)local_118 ^ (uint)local_f8;
      uStack_d4 = local_118._4_4_ ^ local_f8._4_4_;
      uStack_d0 = (uint)uStack_110 ^ (uint)uStack_f0;
      uStack_cc = uStack_110._4_4_ ^ uStack_f0._4_4_;
      local_128 = CONCAT44(local_108._4_4_ ^ local_158._4_4_,(uint)local_108 ^ (uint)local_158);
      uStack_120 = CONCAT44(uStack_100._4_4_ ^ uStack_150._4_4_,(uint)uStack_100 ^ (uint)uStack_150)
      ;
      local_1a8 = *(undefined8 *)(src + lVar20 + 0x80);
      uStack_1a0 = *(undefined8 *)(src + lVar20 + 0x80 + 8);
      local_98 = *(undefined8 *)(src + lVar20 + 0x90);
      uStack_90 = *(undefined8 *)(src + lVar20 + 0x90 + 8);
      local_a8 = *(undefined8 *)(src + lVar20 + 0xa0);
      uStack_a0 = *(undefined8 *)(src + lVar20 + 0xa0 + 8);
      local_178 = *(undefined8 *)(src + lVar20 + 0xb0);
      uStack_170 = *(undefined8 *)(src + lVar20 + 0xb0 + 8);
      local_70 = len;
      fold_12((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0x80);
      *puVar1 = (uint)local_1a8;
      puVar1[1] = local_1a8._4_4_;
      puVar1[2] = (uint)uStack_1a0;
      puVar1[3] = uStack_1a0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x90);
      *puVar1 = (uint)local_98;
      puVar1[1] = local_98._4_4_;
      puVar1[2] = (uint)uStack_90;
      puVar1[3] = uStack_90._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0xa0);
      *puVar1 = (uint)local_a8;
      puVar1[1] = local_a8._4_4_;
      puVar1[2] = (uint)uStack_a0;
      puVar1[3] = uStack_a0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0xb0);
      *puVar1 = (uint)local_178;
      puVar1[1] = local_178._4_4_;
      puVar1[2] = (uint)uStack_170;
      puVar1[3] = uStack_170._4_4_;
      local_1e8._0_4_ = (uint)local_1e8 ^ (uint)local_148 ^ (uint)local_1a8;
      local_1e8._4_4_ = local_1e8._4_4_ ^ local_148._4_4_ ^ local_1a8._4_4_;
      uStack_1e0._0_4_ = (uint)uStack_1e0 ^ (uint)uStack_140 ^ (uint)uStack_1a0;
      uStack_1e0._4_4_ = uStack_1e0._4_4_ ^ uStack_140._4_4_ ^ uStack_1a0._4_4_;
      local_1c8._4_4_ = local_98._4_4_ ^ local_198._4_4_ ^ local_1c8._4_4_ ^ local_f8._4_4_;
      local_1c8._0_4_ = (uint)local_98 ^ (uint)local_198 ^ local_1c8._0_4_ ^ (uint)local_f8;
      uStack_1c0._0_4_ = (uint)uStack_90 ^ (uint)uStack_190 ^ (uint)uStack_1c0 ^ (uint)uStack_f0;
      uStack_1c0._4_4_ = uStack_90._4_4_ ^ uStack_190._4_4_ ^ uStack_1c0._4_4_ ^ uStack_f0._4_4_;
      local_98 = CONCAT44(local_168._4_4_ ^ local_158._4_4_,(uint)local_168 ^ (uint)local_158);
      uStack_90 = CONCAT44(uStack_160._4_4_ ^ uStack_150._4_4_,(uint)uStack_160 ^ (uint)uStack_150);
      local_1d8._4_4_ =
           local_1d8._4_4_ ^ local_f8._4_4_ ^ local_168._4_4_ ^ local_158._4_4_ ^ local_a8._4_4_;
      local_1d8._0_4_ =
           local_1d8._0_4_ ^ (uint)local_f8 ^ (uint)local_168 ^ (uint)local_158 ^ (uint)local_a8;
      uStack_1d0._0_4_ =
           (uint)uStack_1d0 ^ (uint)uStack_f0 ^ (uint)uStack_160 ^ (uint)uStack_150 ^
           (uint)uStack_a0;
      uStack_1d0._4_4_ =
           uStack_1d0._4_4_ ^ uStack_f0._4_4_ ^ uStack_160._4_4_ ^ uStack_150._4_4_ ^
           uStack_a0._4_4_;
      local_a8 = CONCAT44(local_138._4_4_ ^ local_148._4_4_,(uint)local_138 ^ (uint)local_148);
      uStack_a0 = CONCAT44(uStack_130._4_4_ ^ uStack_140._4_4_,(uint)uStack_130 ^ (uint)uStack_140);
      local_1f8._4_4_ =
           local_1f8._4_4_ ^ local_158._4_4_ ^ local_138._4_4_ ^ local_148._4_4_ ^ local_178._4_4_;
      local_1f8._0_4_ =
           local_1f8._0_4_ ^ (uint)local_158 ^ (uint)local_138 ^ (uint)local_148 ^ (uint)local_178;
      uStack_1f0._0_4_ =
           (uint)uStack_1f0 ^ (uint)uStack_150 ^ (uint)uStack_130 ^ (uint)uStack_140 ^
           (uint)uStack_170;
      uStack_1f0._4_4_ =
           uStack_1f0._4_4_ ^ uStack_150._4_4_ ^ uStack_130._4_4_ ^ uStack_140._4_4_ ^
           uStack_170._4_4_;
      local_1b8 = *(undefined8 *)(src + lVar20 + 0xc0);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0xc0 + 8);
      local_188 = *(undefined8 *)(src + lVar20 + 0xd0);
      uStack_180 = *(undefined8 *)(src + lVar20 + 0xd0 + 8);
      local_1a8 = *(undefined8 *)(src + lVar20 + 0xe0);
      uStack_1a0 = *(undefined8 *)(src + lVar20 + 0xe0 + 8);
      local_178 = *(undefined8 *)(src + lVar20 + 0xf0);
      uStack_170 = *(undefined8 *)(src + lVar20 + 0xf0 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0xc0);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0xd0);
      *puVar1 = (uint)local_188;
      puVar1[1] = local_188._4_4_;
      puVar1[2] = (uint)uStack_180;
      puVar1[3] = uStack_180._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0xe0);
      *puVar1 = (uint)local_1a8;
      puVar1[1] = local_1a8._4_4_;
      puVar1[2] = (uint)uStack_1a0;
      puVar1[3] = uStack_1a0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0xf0);
      *puVar1 = (uint)local_178;
      puVar1[1] = local_178._4_4_;
      puVar1[2] = (uint)uStack_170;
      puVar1[3] = uStack_170._4_4_;
      local_1e8._0_4_ =
           (uint)local_1b8 ^ local_d8 ^ (uint)local_1e8 ^ (uint)local_148 ^ (uint)local_198;
      local_1e8._4_4_ =
           local_1b8._4_4_ ^ uStack_d4 ^ local_1e8._4_4_ ^ local_148._4_4_ ^ local_198._4_4_;
      uStack_1e0._0_4_ =
           (uint)uStack_1b0 ^ uStack_d0 ^ (uint)uStack_1e0 ^ (uint)uStack_140 ^ (uint)uStack_190;
      uStack_1e0._4_4_ =
           uStack_1b0._4_4_ ^ uStack_cc ^ uStack_1e0._4_4_ ^ uStack_140._4_4_ ^ uStack_190._4_4_;
      local_1c8._4_4_ =
           local_188._4_4_ ^ local_128._4_4_ ^ local_1c8._4_4_ ^ local_198._4_4_ ^ local_168._4_4_;
      local_1c8._0_4_ =
           (uint)local_188 ^ (uint)local_128 ^ local_1c8._0_4_ ^ (uint)local_198 ^ (uint)local_168;
      uStack_1c0._0_4_ =
           (uint)uStack_180 ^ (uint)uStack_120 ^
           (uint)uStack_1c0 ^ (uint)uStack_190 ^ (uint)uStack_160;
      uStack_1c0._4_4_ =
           uStack_180._4_4_ ^ uStack_120._4_4_ ^
           uStack_1c0._4_4_ ^ uStack_190._4_4_ ^ uStack_160._4_4_;
      local_1d8._4_4_ = local_1a8._4_4_ ^ local_138._4_4_ ^ local_1d8._4_4_ ^ local_168._4_4_;
      local_1d8._0_4_ = (uint)local_1a8 ^ (uint)local_138 ^ local_1d8._0_4_ ^ (uint)local_168;
      uStack_1d0._0_4_ = (uint)uStack_1a0 ^ (uint)uStack_130 ^ (uint)uStack_1d0 ^ (uint)uStack_160;
      uStack_1d0._4_4_ = uStack_1a0._4_4_ ^ uStack_130._4_4_ ^ uStack_1d0._4_4_ ^ uStack_160._4_4_;
      local_1f8._4_4_ = local_1f8._4_4_ ^ local_138._4_4_ ^ uStack_d4 ^ local_178._4_4_;
      local_1f8._0_4_ = local_1f8._0_4_ ^ (uint)local_138 ^ local_d8 ^ (uint)local_178;
      uStack_1f0._0_4_ = (uint)uStack_1f0 ^ (uint)uStack_130 ^ uStack_d0 ^ (uint)uStack_170;
      uStack_1f0._4_4_ = uStack_1f0._4_4_ ^ uStack_130._4_4_ ^ uStack_cc ^ uStack_170._4_4_;
      local_178 = *(undefined8 *)(src + lVar20 + 0x100);
      uStack_170 = *(undefined8 *)(src + lVar20 + 0x100 + 8);
      local_1b8 = *(undefined8 *)(src + lVar20 + 0x110);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0x110 + 8);
      local_188 = *(undefined8 *)(src + lVar20 + 0x120);
      uStack_180 = *(undefined8 *)(src + lVar20 + 0x120 + 8);
      local_1a8 = *(undefined8 *)(src + lVar20 + 0x130);
      uStack_1a0 = *(undefined8 *)(src + lVar20 + 0x130 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0x100);
      *puVar1 = (uint)local_178;
      puVar1[1] = local_178._4_4_;
      puVar1[2] = (uint)uStack_170;
      puVar1[3] = uStack_170._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x110);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x120);
      *puVar1 = (uint)local_188;
      puVar1[1] = local_188._4_4_;
      puVar1[2] = (uint)uStack_180;
      puVar1[3] = uStack_180._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x130);
      *puVar1 = (uint)local_1a8;
      puVar1[1] = local_1a8._4_4_;
      puVar1[2] = (uint)uStack_1a0;
      puVar1[3] = uStack_1a0._4_4_;
      local_1e8._0_4_ = (uint)local_1e8 ^ (uint)local_118 ^ (uint)local_128 ^ (uint)local_178;
      local_1e8._4_4_ = local_1e8._4_4_ ^ local_118._4_4_ ^ local_128._4_4_ ^ local_178._4_4_;
      uStack_1e0._0_4_ = (uint)uStack_1e0 ^ (uint)uStack_110 ^ (uint)uStack_120 ^ (uint)uStack_170;
      uStack_1e0._4_4_ = uStack_1e0._4_4_ ^ uStack_110._4_4_ ^ uStack_120._4_4_ ^ uStack_170._4_4_;
      local_1c8._4_4_ = local_1c8._4_4_ ^ local_108._4_4_ ^ local_1b8._4_4_;
      local_1c8._0_4_ = local_1c8._0_4_ ^ (uint)local_108 ^ (uint)local_1b8;
      uStack_1c0._0_4_ = (uint)uStack_1c0 ^ (uint)uStack_100 ^ (uint)uStack_1b0;
      uStack_1c0._4_4_ = uStack_1c0._4_4_ ^ uStack_100._4_4_ ^ uStack_1b0._4_4_;
      local_1d8._4_4_ = local_1d8._4_4_ ^ local_148._4_4_ ^ local_188._4_4_;
      local_1d8._0_4_ = local_1d8._0_4_ ^ (uint)local_148 ^ (uint)local_188;
      uStack_1d0._0_4_ = (uint)uStack_1d0 ^ (uint)uStack_140 ^ (uint)uStack_180;
      uStack_1d0._4_4_ = uStack_1d0._4_4_ ^ uStack_140._4_4_ ^ uStack_180._4_4_;
      local_1f8._4_4_ = local_1f8._4_4_ ^ local_198._4_4_ ^ local_1a8._4_4_;
      local_1f8._0_4_ = local_1f8._0_4_ ^ (uint)local_198 ^ (uint)local_1a8;
      uStack_1f0._0_4_ = (uint)uStack_1f0 ^ (uint)uStack_190 ^ (uint)uStack_1a0;
      uStack_1f0._4_4_ = uStack_1f0._4_4_ ^ uStack_190._4_4_ ^ uStack_1a0._4_4_;
      local_1b8 = *(undefined8 *)(src + lVar20 + 0x140);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0x140 + 8);
      local_188 = *(undefined8 *)(src + lVar20 + 0x150);
      uStack_180 = *(undefined8 *)(src + lVar20 + 0x150 + 8);
      local_1a8 = *(undefined8 *)(src + lVar20 + 0x160);
      uStack_1a0 = *(undefined8 *)(src + lVar20 + 0x160 + 8);
      local_178 = *(undefined8 *)(src + lVar20 + 0x170);
      uStack_170 = *(undefined8 *)(src + lVar20 + 0x170 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0x140);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x150);
      *puVar1 = (uint)local_188;
      puVar1[1] = local_188._4_4_;
      puVar1[2] = (uint)uStack_180;
      puVar1[3] = uStack_180._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x160);
      *puVar1 = (uint)local_1a8;
      puVar1[1] = local_1a8._4_4_;
      puVar1[2] = (uint)uStack_1a0;
      puVar1[3] = uStack_1a0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x170);
      *puVar1 = (uint)local_178;
      puVar1[1] = local_178._4_4_;
      puVar1[2] = (uint)uStack_170;
      puVar1[3] = uStack_170._4_4_;
      local_1e8._0_4_ = (uint)local_1b8 ^ (uint)local_168 ^ (uint)local_1e8 ^ (uint)local_f8;
      local_1e8._4_4_ = local_1b8._4_4_ ^ local_168._4_4_ ^ local_1e8._4_4_ ^ local_f8._4_4_;
      uStack_1e0._0_4_ = (uint)uStack_1b0 ^ (uint)uStack_160 ^ (uint)uStack_1e0 ^ (uint)uStack_f0;
      uStack_1e0._4_4_ = uStack_1b0._4_4_ ^ uStack_160._4_4_ ^ uStack_1e0._4_4_ ^ uStack_f0._4_4_;
      local_1c8._4_4_ =
           local_138._4_4_ ^ local_f8._4_4_ ^ local_1c8._4_4_ ^ local_158._4_4_ ^ local_188._4_4_;
      local_1c8._0_4_ =
           (uint)local_138 ^ (uint)local_f8 ^ local_1c8._0_4_ ^ (uint)local_158 ^ (uint)local_188;
      uStack_1c0._0_4_ =
           (uint)uStack_130 ^ (uint)uStack_f0 ^ (uint)uStack_1c0 ^ (uint)uStack_150 ^
           (uint)uStack_180;
      uStack_1c0._4_4_ =
           uStack_130._4_4_ ^ uStack_f0._4_4_ ^ uStack_1c0._4_4_ ^ uStack_150._4_4_ ^
           uStack_180._4_4_;
      local_1d8._4_4_ =
           local_118._4_4_ ^ local_148._4_4_ ^ local_1d8._4_4_ ^ local_158._4_4_ ^ local_1a8._4_4_;
      local_1d8._0_4_ =
           (uint)local_118 ^ (uint)local_148 ^ local_1d8._0_4_ ^ (uint)local_158 ^ (uint)local_1a8;
      uStack_1d0._0_4_ =
           (uint)uStack_110 ^ (uint)uStack_140 ^ (uint)uStack_1d0 ^ (uint)uStack_150 ^
           (uint)uStack_1a0;
      uStack_1d0._4_4_ =
           uStack_110._4_4_ ^ uStack_140._4_4_ ^ uStack_1d0._4_4_ ^ uStack_150._4_4_ ^
           uStack_1a0._4_4_;
      local_1f8._4_4_ =
           local_108._4_4_ ^ local_198._4_4_ ^ local_1f8._4_4_ ^ local_148._4_4_ ^ local_178._4_4_;
      local_1f8._0_4_ =
           (uint)local_108 ^ (uint)local_198 ^ local_1f8._0_4_ ^ (uint)local_148 ^ (uint)local_178;
      uStack_1f0._0_4_ =
           (uint)uStack_100 ^ (uint)uStack_190 ^ (uint)uStack_1f0 ^ (uint)uStack_140 ^
           (uint)uStack_170;
      uStack_1f0._4_4_ =
           uStack_100._4_4_ ^ uStack_190._4_4_ ^ uStack_1f0._4_4_ ^ uStack_140._4_4_ ^
           uStack_170._4_4_;
      local_118 = *(undefined8 *)(src + lVar20 + 0x180);
      uStack_110 = *(undefined8 *)(src + lVar20 + 0x180 + 8);
      local_108 = *(undefined8 *)(src + lVar20 + 400);
      uStack_100 = *(undefined8 *)(src + lVar20 + 400 + 8);
      local_b8 = *(undefined8 *)(src + lVar20 + 0x1a0);
      uStack_b0 = *(undefined8 *)(src + lVar20 + 0x1a0 + 8);
      local_1b8 = *(undefined8 *)(src + lVar20 + 0x1b0);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0x1b0 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0x180);
      *puVar1 = (uint)local_118;
      puVar1[1] = local_118._4_4_;
      puVar1[2] = (uint)uStack_110;
      puVar1[3] = uStack_110._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 400);
      *puVar1 = (uint)local_108;
      puVar1[1] = local_108._4_4_;
      puVar1[2] = (uint)uStack_100;
      puVar1[3] = uStack_100._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x1a0);
      *puVar1 = (uint)local_b8;
      puVar1[1] = local_b8._4_4_;
      puVar1[2] = (uint)uStack_b0;
      puVar1[3] = uStack_b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x1b0);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      local_1a8._0_4_ = (uint)local_198 ^ (uint)local_148;
      local_1a8._4_4_ = local_198._4_4_ ^ local_148._4_4_;
      uStack_1a0._0_4_ = (uint)uStack_190 ^ (uint)uStack_140;
      uStack_1a0._4_4_ = uStack_190._4_4_ ^ uStack_140._4_4_;
      local_1e8._0_4_ =
           (uint)local_118 ^ (uint)local_168 ^ (uint)local_1e8 ^ (uint)local_f8 ^ (uint)local_1a8;
      local_1e8._4_4_ =
           local_118._4_4_ ^ local_168._4_4_ ^ local_1e8._4_4_ ^ local_f8._4_4_ ^ local_1a8._4_4_;
      uStack_1e0._0_4_ =
           (uint)uStack_110 ^ (uint)uStack_160 ^
           (uint)uStack_1e0 ^ (uint)uStack_f0 ^ (uint)uStack_1a0;
      uStack_1e0._4_4_ =
           uStack_110._4_4_ ^ uStack_160._4_4_ ^
           uStack_1e0._4_4_ ^ uStack_f0._4_4_ ^ uStack_1a0._4_4_;
      local_118 = CONCAT44(local_198._4_4_ ^ local_158._4_4_,(uint)local_198 ^ (uint)local_158);
      uStack_110 = CONCAT44(uStack_190._4_4_ ^ uStack_150._4_4_,(uint)uStack_190 ^ (uint)uStack_150)
      ;
      local_178 = CONCAT44(local_168._4_4_ ^ local_138._4_4_,(uint)local_168 ^ (uint)local_138);
      uStack_170 = CONCAT44(uStack_160._4_4_ ^ uStack_130._4_4_,(uint)uStack_160 ^ (uint)uStack_130)
      ;
      local_1c8._4_4_ =
           local_108._4_4_ ^ local_168._4_4_ ^ local_138._4_4_ ^
           local_1c8._4_4_ ^ local_f8._4_4_ ^ local_198._4_4_ ^ local_158._4_4_;
      local_1c8._0_4_ =
           (uint)local_108 ^ (uint)local_168 ^ (uint)local_138 ^
           local_1c8._0_4_ ^ (uint)local_f8 ^ (uint)local_198 ^ (uint)local_158;
      uStack_1c0._0_4_ =
           (uint)uStack_100 ^ (uint)uStack_160 ^ (uint)uStack_130 ^
           (uint)uStack_1c0 ^ (uint)uStack_f0 ^ (uint)uStack_190 ^ (uint)uStack_150;
      uStack_1c0._4_4_ =
           uStack_100._4_4_ ^ uStack_160._4_4_ ^ uStack_130._4_4_ ^
           uStack_1c0._4_4_ ^ uStack_f0._4_4_ ^ uStack_190._4_4_ ^ uStack_150._4_4_;
      local_188._0_4_ = (uint)local_168 ^ (uint)local_148;
      local_188._4_4_ = local_168._4_4_ ^ local_148._4_4_;
      uStack_180._0_4_ = (uint)uStack_160 ^ (uint)uStack_140;
      uStack_180._4_4_ = uStack_160._4_4_ ^ uStack_140._4_4_;
      uVar18 = (uint)local_138 ^ local_d8;
      uVar22 = local_138._4_4_ ^ uStack_d4;
      uVar23 = (uint)uStack_130 ^ uStack_d0;
      uVar24 = uStack_130._4_4_ ^ uStack_cc;
      local_108 = CONCAT44(uVar22,uVar18);
      uStack_100 = CONCAT44(uVar24,uVar23);
      local_1d8._4_4_ =
           local_1d8._4_4_ ^ local_158._4_4_ ^ local_188._4_4_ ^ uVar22 ^ local_b8._4_4_;
      local_1d8._0_4_ =
           local_1d8._0_4_ ^ (uint)local_158 ^ (uint)local_188 ^ uVar18 ^ (uint)local_b8;
      uStack_1d0._0_4_ =
           (uint)uStack_1d0 ^ (uint)uStack_150 ^ (uint)uStack_180 ^ uVar23 ^ (uint)uStack_b0;
      uStack_1d0._4_4_ =
           uStack_1d0._4_4_ ^ uStack_150._4_4_ ^ uStack_180._4_4_ ^ uVar24 ^ uStack_b0._4_4_;
      local_1f8._4_4_ =
           local_1b8._4_4_ ^ local_128._4_4_ ^
           local_1f8._4_4_ ^ local_f8._4_4_ ^ local_1a8._4_4_ ^ uVar22;
      local_1f8._0_4_ =
           (uint)local_1b8 ^ (uint)local_128 ^
           local_1f8._0_4_ ^ (uint)local_f8 ^ (uint)local_1a8 ^ uVar18;
      uStack_1f0._0_4_ =
           (uint)uStack_1b0 ^ (uint)uStack_120 ^
           (uint)uStack_1f0 ^ (uint)uStack_f0 ^ (uint)uStack_1a0 ^ uVar23;
      uStack_1f0._4_4_ =
           uStack_1b0._4_4_ ^ uStack_120._4_4_ ^
           uStack_1f0._4_4_ ^ uStack_f0._4_4_ ^ uStack_1a0._4_4_ ^ uVar24;
      local_58 = *(undefined8 *)(src + lVar20 + 0x1c0);
      uStack_50 = *(undefined8 *)(src + lVar20 + 0x1c0 + 8);
      local_48 = *(undefined8 *)(src + lVar20 + 0x1d0);
      uStack_40 = *(undefined8 *)(src + lVar20 + 0x1d0 + 8);
      local_b8 = *(undefined8 *)(src + lVar20 + 0x1e0);
      uStack_b0 = *(undefined8 *)(src + lVar20 + 0x1e0 + 8);
      local_1b8 = *(undefined8 *)(src + lVar20 + 0x1f0);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0x1f0 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      puVar1 = (uint *)(dst + lVar20 + 0x1c0);
      *puVar1 = (uint)local_58;
      puVar1[1] = local_58._4_4_;
      puVar1[2] = (uint)uStack_50;
      puVar1[3] = uStack_50._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x1d0);
      *puVar1 = (uint)local_48;
      puVar1[1] = local_48._4_4_;
      puVar1[2] = (uint)uStack_40;
      puVar1[3] = uStack_40._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x1e0);
      *puVar1 = (uint)local_b8;
      puVar1[1] = local_b8._4_4_;
      puVar1[2] = (uint)uStack_b0;
      puVar1[3] = uStack_b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x1f0);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      local_1e8._0_4_ =
           (uint)local_58 ^ (uint)local_128 ^
           (uint)local_1e8 ^ (uint)local_f8 ^ (uint)local_118 ^ (uint)local_168 ^ local_d8;
      local_1e8._4_4_ =
           local_58._4_4_ ^ local_128._4_4_ ^
           local_1e8._4_4_ ^ local_f8._4_4_ ^ local_118._4_4_ ^ local_168._4_4_ ^ uStack_d4;
      uStack_1e0._0_4_ =
           (uint)uStack_50 ^ (uint)uStack_120 ^
           (uint)uStack_1e0 ^ (uint)uStack_f0 ^ (uint)uStack_110 ^ (uint)uStack_160 ^ uStack_d0;
      uStack_1e0._4_4_ =
           uStack_50._4_4_ ^ uStack_120._4_4_ ^
           uStack_1e0._4_4_ ^ uStack_f0._4_4_ ^ uStack_110._4_4_ ^ uStack_160._4_4_ ^ uStack_cc;
      local_1c8._4_4_ =
           local_138._4_4_ ^ local_128._4_4_ ^ local_158._4_4_ ^ local_1c8._4_4_ ^ local_188._4_4_ ^
           local_48._4_4_;
      local_1c8._0_4_ =
           (uint)local_138 ^ (uint)local_128 ^ (uint)local_158 ^ local_1c8._0_4_ ^ (uint)local_188 ^
           (uint)local_48;
      uStack_1c0._0_4_ =
           (uint)uStack_130 ^ (uint)uStack_120 ^
           (uint)uStack_150 ^ (uint)uStack_1c0 ^ (uint)uStack_180 ^ (uint)uStack_40;
      uStack_1c0._4_4_ =
           uStack_130._4_4_ ^ uStack_120._4_4_ ^
           uStack_150._4_4_ ^ uStack_1c0._4_4_ ^ uStack_180._4_4_ ^ uStack_40._4_4_;
      local_1d8._4_4_ =
           local_1d8._4_4_ ^ local_f8._4_4_ ^ local_1a8._4_4_ ^ local_108._4_4_ ^ local_b8._4_4_;
      local_1d8._0_4_ =
           local_1d8._0_4_ ^ (uint)local_f8 ^ (uint)local_1a8 ^ (uint)local_108 ^ (uint)local_b8;
      uStack_1d0._0_4_ =
           (uint)uStack_1d0 ^ (uint)uStack_f0 ^ (uint)uStack_1a0 ^ (uint)uStack_100 ^
           (uint)uStack_b0;
      uStack_1d0._4_4_ =
           uStack_1d0._4_4_ ^ uStack_f0._4_4_ ^ uStack_1a0._4_4_ ^ uStack_100._4_4_ ^
           uStack_b0._4_4_;
      local_1f8._4_4_ =
           local_1b8._4_4_ ^ local_128._4_4_ ^
           local_1f8._4_4_ ^ local_f8._4_4_ ^ local_118._4_4_ ^ local_168._4_4_ ^ uStack_d4;
      local_1f8._0_4_ =
           (uint)local_1b8 ^ (uint)local_128 ^
           local_1f8._0_4_ ^ (uint)local_f8 ^ (uint)local_118 ^ (uint)local_168 ^ local_d8;
      uStack_1f0._0_4_ =
           (uint)uStack_1b0 ^ (uint)uStack_120 ^
           (uint)uStack_1f0 ^ (uint)uStack_f0 ^ (uint)uStack_110 ^ (uint)uStack_160 ^ uStack_d0;
      uStack_1f0._4_4_ =
           uStack_1b0._4_4_ ^ uStack_120._4_4_ ^
           uStack_1f0._4_4_ ^ uStack_f0._4_4_ ^ uStack_110._4_4_ ^ uStack_160._4_4_ ^ uStack_cc;
      local_158 = *(ulong *)(src + lVar20 + 0x200);
      uStack_150 = *(ulong *)(src + lVar20 + 0x200 + 8);
      local_1b8 = *(undefined8 *)(src + lVar20 + 0x210);
      uStack_1b0 = *(undefined8 *)(src + lVar20 + 0x210 + 8);
      local_188 = *(undefined8 *)(src + lVar20 + 0x220);
      uStack_180 = *(undefined8 *)(src + lVar20 + 0x220 + 8);
      local_1a8 = *(undefined8 *)(src + lVar20 + 0x230);
      uStack_1a0 = *(undefined8 *)(src + lVar20 + 0x230 + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      uVar17 = local_70;
      puVar1 = (uint *)(dst + lVar20 + 0x200);
      *puVar1 = (uint)local_158;
      puVar1[1] = local_158._4_4_;
      puVar1[2] = (uint)uStack_150;
      puVar1[3] = uStack_150._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x210);
      *puVar1 = (uint)local_1b8;
      puVar1[1] = local_1b8._4_4_;
      puVar1[2] = (uint)uStack_1b0;
      puVar1[3] = uStack_1b0._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x220);
      *puVar1 = (uint)local_188;
      puVar1[1] = local_188._4_4_;
      puVar1[2] = (uint)uStack_180;
      puVar1[3] = uStack_180._4_4_;
      puVar1 = (uint *)(dst + lVar20 + 0x230);
      *puVar1 = (uint)local_1a8;
      puVar1[1] = local_1a8._4_4_;
      puVar1[2] = (uint)uStack_1a0;
      puVar1[3] = uStack_1a0._4_4_;
      local_1e8 = CONCAT44(local_a8._4_4_ ^ local_128._4_4_ ^
                           local_f8._4_4_ ^ local_1e8._4_4_ ^ local_98._4_4_ ^ local_158._4_4_,
                           (uint)local_a8 ^ (uint)local_128 ^
                           (uint)local_f8 ^ (uint)local_1e8 ^ (uint)local_98 ^ (uint)local_158);
      uStack_1e0 = CONCAT44(uStack_a0._4_4_ ^ uStack_120._4_4_ ^
                            uStack_f0._4_4_ ^ uStack_1e0._4_4_ ^ uStack_90._4_4_ ^ uStack_150._4_4_,
                            (uint)uStack_a0 ^ (uint)uStack_120 ^
                            (uint)uStack_f0 ^ (uint)uStack_1e0 ^ (uint)uStack_90 ^ (uint)uStack_150)
      ;
      local_1c8._4_4_ =
           local_1c8._4_4_ ^ local_148._4_4_ ^ local_118._4_4_ ^ local_108._4_4_ ^ local_1b8._4_4_;
      local_1c8._0_4_ =
           local_1c8._0_4_ ^ (uint)local_148 ^ (uint)local_118 ^ (uint)local_108 ^ (uint)local_1b8;
      uStack_1c0._0_4_ =
           (uint)uStack_1c0 ^ (uint)uStack_140 ^ (uint)uStack_110 ^ (uint)uStack_100 ^
           (uint)uStack_1b0;
      uStack_1c0._4_4_ =
           uStack_1c0._4_4_ ^ uStack_140._4_4_ ^ uStack_110._4_4_ ^ uStack_100._4_4_ ^
           uStack_1b0._4_4_;
      local_1d8._4_4_ =
           uStack_d4 ^ local_128._4_4_ ^
           local_198._4_4_ ^ local_168._4_4_ ^ local_148._4_4_ ^ local_1d8._4_4_ ^ local_188._4_4_;
      local_1d8._0_4_ =
           local_d8 ^ (uint)local_128 ^
           (uint)local_198 ^ (uint)local_168 ^ (uint)local_148 ^ local_1d8._0_4_ ^ (uint)local_188;
      uStack_1d0._0_4_ =
           uStack_d0 ^ (uint)uStack_120 ^
           (uint)uStack_190 ^ (uint)uStack_160 ^ (uint)uStack_140 ^ (uint)uStack_1d0 ^
           (uint)uStack_180;
      uStack_1d0._4_4_ =
           uStack_cc ^ uStack_120._4_4_ ^
           uStack_190._4_4_ ^ uStack_160._4_4_ ^ uStack_140._4_4_ ^ uStack_1d0._4_4_ ^
           uStack_180._4_4_;
      local_1f8._4_4_ =
           local_1a8._4_4_ ^ local_128._4_4_ ^ local_198._4_4_ ^ local_1f8._4_4_ ^ local_178._4_4_;
      local_1f8._0_4_ =
           (uint)local_1a8 ^ (uint)local_128 ^ (uint)local_198 ^ local_1f8._0_4_ ^ (uint)local_178;
      uStack_1f0._0_4_ =
           (uint)uStack_1a0 ^ (uint)uStack_120 ^
           (uint)uStack_190 ^ (uint)uStack_1f0 ^ (uint)uStack_170;
      uStack_1f0._4_4_ =
           uStack_1a0._4_4_ ^ uStack_120._4_4_ ^
           uStack_190._4_4_ ^ uStack_1f0._4_4_ ^ uStack_170._4_4_;
      local_158 = *(ulong *)(src + lVar20 + 0x240);
      uStack_150 = *(ulong *)((long)(src + lVar20 + 0x240) + 8);
      local_f8 = *(ulong *)(src + lVar20 + 0x250);
      uStack_f0 = *(ulong *)((long)(src + lVar20 + 0x250) + 8);
      local_148 = *(ulong *)(src + lVar20 + 0x260);
      uStack_140 = *(ulong *)((long)(src + lVar20 + 0x260) + 8);
      local_198 = *(ulong *)(src + lVar20 + 0x270);
      uStack_190 = *(ulong *)((long)(src + lVar20 + 0x270) + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      *(ulong *)(dst + lVar20 + 0x240) = local_158;
      *(ulong *)((long)(dst + lVar20 + 0x240) + 8) = uStack_150;
      *(ulong *)(dst + lVar20 + 0x250) = local_f8;
      *(ulong *)((long)(dst + lVar20 + 0x250) + 8) = uStack_f0;
      *(ulong *)(dst + lVar20 + 0x260) = local_148;
      *(ulong *)((long)(dst + lVar20 + 0x260) + 8) = uStack_140;
      *(ulong *)(dst + lVar20 + 0x270) = local_198;
      *(ulong *)((long)(dst + lVar20 + 0x270) + 8) = uStack_190;
      uVar19 = CONCAT44(uStack_d4,local_d8);
      uVar16 = CONCAT44(uStack_cc,uStack_d0);
      local_1e8 = local_158 ^ uVar19 ^ local_168 ^ local_1e8 ^ local_138;
      uStack_1e0 = uStack_150 ^ uVar16 ^ uStack_160 ^ uStack_1e0 ^ uStack_130;
      uStack_1c0 = uStack_f0 ^ uStack_120 ^ uStack_130 ^ uStack_1c0 ^ uVar16;
      local_1c8 = (undefined1  [8])(local_f8 ^ local_128 ^ local_138 ^ (ulong)local_1c8 ^ uVar19);
      uStack_1d0 = uStack_140 ^ uStack_120 ^ uVar16 ^ uStack_1d0;
      local_1d8 = (undefined1  [8])(local_148 ^ local_128 ^ uVar19 ^ (ulong)local_1d8);
      uStack_1f0 = uStack_120 ^ uStack_1f0 ^ uStack_190;
      local_1f8 = (undefined1  [8])(local_128 ^ (ulong)local_1f8 ^ local_198);
      lVar20 = lVar20 + 0x280;
      len = uVar17 - 0x280;
    }
    for (; 0x3f < len; len = len - 0x40) {
      local_198 = *(ulong *)(src + lVar20);
      uStack_190 = *(ulong *)((long)(src + lVar20) + 8);
      local_138 = *(ulong *)(src + lVar20 + 0x10);
      uStack_130 = *(ulong *)((long)(src + lVar20 + 0x10) + 8);
      local_128 = *(ulong *)(src + lVar20 + 0x20);
      uStack_120 = *(ulong *)((long)(src + lVar20 + 0x20) + 8);
      local_168 = *(ulong *)(src + lVar20 + 0x30);
      uStack_160 = *(ulong *)((long)(src + lVar20 + 0x30) + 8);
      fold_4((__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,(__m128i *)local_1f8);
      *(ulong *)(dst + lVar20) = local_198;
      *(ulong *)((long)(dst + lVar20) + 8) = uStack_190;
      *(ulong *)(dst + lVar20 + 0x10) = local_138;
      *(ulong *)((long)(dst + lVar20 + 0x10) + 8) = uStack_130;
      *(ulong *)(dst + lVar20 + 0x20) = local_128;
      *(ulong *)((long)(dst + lVar20 + 0x20) + 8) = uStack_120;
      *(ulong *)(dst + lVar20 + 0x30) = local_168;
      *(ulong *)((long)(dst + lVar20 + 0x30) + 8) = uStack_160;
      local_1e8 = local_198 ^ local_1e8;
      uStack_1e0 = uStack_190 ^ uStack_1e0;
      uStack_1c0 = uStack_130 ^ uStack_1c0;
      local_1c8 = (undefined1  [8])(local_138 ^ (ulong)local_1c8);
      uStack_1d0 = uStack_120 ^ uStack_1d0;
      local_1d8 = (undefined1  [8])(local_128 ^ (ulong)local_1d8);
      uStack_1f0 = uStack_160 ^ uStack_1f0;
      local_1f8 = (undefined1  [8])(local_168 ^ (ulong)local_1f8);
      lVar20 = lVar20 + 0x40;
    }
    if (len < 0x30) {
      if (len < 0x20) {
        if (len < 0x10) {
          src = src + lVar20;
          dst = dst + lVar20;
        }
        else {
          len = (local_e0 - lVar20) - 0x10;
          pauVar21 = (undefined1 (*) [16])(src + lVar20);
          src = (uint8_t *)(pauVar21 + 1);
          auVar2 = *pauVar21;
          dst = dst + lVar20 + 0x10;
          *(undefined1 (*) [16])(dst + -0x10) = auVar2;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uStack_1e0;
          auVar3 = (undefined1  [16])0x0;
          for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
            if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
              auVar3 = auVar3 ^ auVar4 << uVar18;
            }
          }
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_1e8;
          auVar4 = (undefined1  [16])0x0;
          for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
            if ((auVar5 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
              auVar4 = auVar4 ^ ZEXT816(0x154442bd4) << uVar18;
            }
          }
          local_1e8 = (ulong)local_1c8;
          uStack_1e0 = uStack_1c0;
          local_1c8 = local_1d8;
          uStack_1c0 = uStack_1d0;
          local_1d8 = local_1f8;
          uStack_1d0 = uStack_1f0;
          _local_1f8 = (__m128i)(auVar4 ^ auVar3 ^ auVar2);
        }
      }
      else {
        len = (local_e0 - lVar20) - 0x20;
        pauVar21 = (undefined1 (*) [16])(src + lVar20);
        src = (uint8_t *)(pauVar21 + 2);
        auVar2 = *pauVar21;
        auVar3 = pauVar21[1];
        dst = dst + lVar20 + 0x20;
        *(undefined1 (*) [16])(dst + -0x20) = auVar2;
        *(undefined1 (*) [16])(dst + -0x10) = auVar3;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uStack_1c0;
        auVar4 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar6 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar4 = auVar4 ^ ZEXT816(0x1c6e41596) << uVar18;
          }
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_1c8;
        auVar5 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar7 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar5 = auVar5 ^ ZEXT816(0x154442bd4) << uVar18;
          }
        }
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uStack_1e0;
        auVar6 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar6 = auVar6 ^ auVar8 << uVar18;
          }
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_1e8;
        auVar7 = (undefined1  [16])0x0;
        for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
          if ((auVar9 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
            auVar7 = auVar7 ^ ZEXT816(0x154442bd4) << uVar18;
          }
        }
        local_1e8 = (ulong)local_1d8;
        uStack_1e0 = uStack_1d0;
        local_1c8 = local_1f8;
        uStack_1c0 = uStack_1f0;
        _local_1d8 = (__m128i)(auVar7 ^ auVar6 ^ auVar2);
        _local_1f8 = (__m128i)(auVar5 ^ auVar4 ^ auVar3);
      }
    }
    else {
      len = (local_e0 - lVar20) - 0x30;
      pauVar21 = (undefined1 (*) [16])(src + lVar20);
      src = (uint8_t *)(pauVar21 + 3);
      auVar2 = *pauVar21;
      auVar3 = pauVar21[1];
      auVar4 = pauVar21[2];
      dst = dst + lVar20 + 0x30;
      *(undefined1 (*) [16])(dst + -0x30) = auVar2;
      *(undefined1 (*) [16])(dst + -0x20) = auVar3;
      *(undefined1 (*) [16])(dst + -0x10) = auVar4;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uStack_1d0;
      auVar5 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar10 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar5 = auVar5 ^ ZEXT816(0x1c6e41596) << uVar18;
        }
      }
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1d8;
      auVar6 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar12 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar6 = auVar6 ^ ZEXT816(0x154442bd4) << uVar18;
        }
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uStack_1c0;
      auVar7 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar11 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar7 = auVar7 ^ ZEXT816(0x1c6e41596) << uVar18;
        }
      }
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1c8;
      auVar8 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar13 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar8 = auVar8 ^ ZEXT816(0x154442bd4) << uVar18;
        }
      }
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uStack_1e0;
      auVar9 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((ZEXT816(0x1c6e41596) & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar9 = auVar9 ^ auVar15 << uVar18;
        }
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_1e8;
      auVar10 = (undefined1  [16])0x0;
      for (uVar18 = 0; uVar18 < 0x40; uVar18 = uVar18 + 1) {
        if ((auVar14 & (undefined1  [16])0x1 << uVar18) != (undefined1  [16])0x0) {
          auVar10 = auVar10 ^ ZEXT816(0x154442bd4) << uVar18;
        }
      }
      local_1e8 = (ulong)local_1f8;
      uStack_1e0 = uStack_1f0;
      _local_1c8 = (__m128i)(auVar10 ^ auVar9 ^ auVar2);
      _local_1d8 = (__m128i)(auVar8 ^ auVar7 ^ auVar3);
      _local_1f8 = (__m128i)(auVar6 ^ auVar5 ^ auVar4);
    }
    crc = local_c0;
    if (len == 0) goto LAB_0011304b;
  }
  memcpy((__m128i *)&local_88,src,len);
  local_68 = local_88;
  lStack_60 = lStack_80;
  memcpy(dst,&local_68,len);
  partial_fold(len,(__m128i *)&local_1e8,(__m128i *)local_1c8,(__m128i *)local_1d8,
               (__m128i *)local_1f8,(__m128i *)&local_88);
LAB_0011304b:
  *(ulong *)crc->fold = local_1e8;
  *(ulong *)(crc->fold + 8) = uStack_1e0;
  *(undefined1 (*) [8])(crc->fold + 0x10) = local_1c8;
  *(ulong *)(crc->fold + 0x18) = uStack_1c0;
  *(undefined1 (*) [8])(crc->fold + 0x20) = local_1d8;
  *(ulong *)(crc->fold + 0x28) = uStack_1d0;
  *(undefined1 (*) [8])(crc->fold + 0x30) = local_1f8;
  *(ulong *)(crc->fold + 0x38) = uStack_1f0;
  return;
}

Assistant:

Z_INTERNAL void CRC32_FOLD(crc32_fold *crc, const uint8_t *src, size_t len, uint32_t init_crc) {
#endif
    unsigned long algn_diff;
    __m128i xmm_t0, xmm_t1, xmm_t2, xmm_t3;
    __m128i xmm_crc0, xmm_crc1, xmm_crc2, xmm_crc3;
    __m128i xmm_crc_part = _mm_setzero_si128();
    char ALIGNED_(16) partial_buf[16] = { 0 };
#ifndef COPY
    __m128i xmm_initial = _mm_cvtsi32_si128(init_crc);
    int32_t first = init_crc != 0;

    /* The CRC functions don't call this for input < 16, as a minimum of 16 bytes of input is needed
     * for the aligning load that occurs.  If there's an initial CRC, to carry it forward through
     * the folded CRC there must be 16 - src % 16 + 16 bytes available, which by definition can be
     * up to 15 bytes + one full vector load. */
    assert(len >= 16 || first == 0);
#endif
    crc32_fold_load((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

    if (len < 16) {
        if (len == 0)
            return;

        memcpy(partial_buf, src, len);
        xmm_crc_part = _mm_load_si128((const __m128i *)partial_buf);
#ifdef COPY
        memcpy(dst, partial_buf, len);
#endif
        goto partial;
    }

    algn_diff = ((uintptr_t)16 - ((uintptr_t)src & 0xF)) & 0xF;
    if (algn_diff) {
        xmm_crc_part = _mm_loadu_si128((__m128i *)src);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_crc_part);
        dst += algn_diff;
#else
        XOR_INITIAL128(xmm_crc_part);

        if (algn_diff < 4 && init_crc != 0) {
            xmm_t0 = xmm_crc_part;
            if (len >= 32) {
                xmm_crc_part = _mm_loadu_si128((__m128i*)src + 1);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
            } else {
                memcpy(partial_buf, src + 16, len - 16);
                xmm_crc_part = _mm_load_si128((__m128i*)partial_buf);
                fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
                xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
                src += 16;
                len -= 16;
#ifdef COPY
                dst -= algn_diff;
#endif
                goto partial;
            }

            src += 16;
            len -= 16;
        }
#endif

        partial_fold(algn_diff, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);

        src += algn_diff;
        len -= algn_diff;
    }

#ifdef X86_VPCLMULQDQ
    if (len >= 256) {
#ifdef COPY
        size_t n = fold_16_vpclmulqdq_copy(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, dst, src, len);
        dst += n;
#else
        size_t n = fold_16_vpclmulqdq(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, src, len,
            xmm_initial, first);
        first = 0;
#endif
        len -= n;
        src += n;
    }
#endif

#ifndef WITHOUT_CHORBA
        /* Implement Chorba algorithm from https://arxiv.org/abs/2412.16398
         * We interleave the PCLMUL-base folds with 8x scaled generator
         * polynomial copies; we read 8x QWORDS and then XOR them into
         * the stream at the following offsets: 6, 9, 10, 16, 20, 22,
         * 24, 25, 27, 28, 30, 31, 32 - this is detailed in the paper
         * as "generator_64_bits_unrolled_8" */
        while (len >= 512 + 64 + 16*8) {
            __m128i chorba8 = _mm_loadu_si128((__m128i *)src);
            __m128i chorba7 = _mm_loadu_si128((__m128i *)src + 1);
            __m128i chorba6 = _mm_loadu_si128((__m128i *)src + 2);
            __m128i chorba5 = _mm_loadu_si128((__m128i *)src + 3);
            __m128i chorba4 = _mm_loadu_si128((__m128i *)src + 4);
            __m128i chorba3 = _mm_loadu_si128((__m128i *)src + 5);
            __m128i chorba2 = _mm_loadu_si128((__m128i *)src + 6);
            __m128i chorba1 = _mm_loadu_si128((__m128i *)src + 7);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, chorba8);
            _mm_storeu_si128((__m128i *)dst + 1, chorba7);
            _mm_storeu_si128((__m128i *)dst + 2, chorba6);
            _mm_storeu_si128((__m128i *)dst + 3, chorba5);
            _mm_storeu_si128((__m128i *)dst + 4, chorba4);
            _mm_storeu_si128((__m128i *)dst + 5, chorba3);
            _mm_storeu_si128((__m128i *)dst + 6, chorba2);
            _mm_storeu_si128((__m128i *)dst + 7, chorba1);
            dst += 16*8;
#else
            XOR_INITIAL128(chorba8);
#endif
            chorba2 = _mm_xor_si128(chorba2, chorba8);
            chorba1 = _mm_xor_si128(chorba1, chorba7);
            src += 16*8;
            len -= 16*8;

            xmm_t0 = _mm_loadu_si128((__m128i *)src);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 1);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 2);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 3);

            fold_12(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(xmm_t0, chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba5), chorba8);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba4), chorba8), chorba7);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba3), chorba7), chorba6);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 4);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 5);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 6);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 7);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba4), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba3), chorba4);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(xmm_t3, chorba2), chorba3);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 8);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 9);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 10);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 11);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba7);
            xmm_t2 = _mm_xor_si128(xmm_t2, chorba6);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 12);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 13);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 14);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 15);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba8), chorba7);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba8), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba7), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 16);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 17);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 18);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 19);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba4), chorba8), chorba6), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba3), chorba4), chorba8), chorba7), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba4), chorba7), chorba6);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 20);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 21);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 22);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 23);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif

            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba3), chorba4), chorba7), chorba6);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba2), chorba3), chorba8), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba2), chorba4), chorba8), chorba7), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 24);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 25);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 26);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 27);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba1), chorba3), chorba4), chorba8), chorba7), chorba6);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba2), chorba3), chorba7), chorba6), chorba5);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2), chorba4), chorba6), chorba5);
            xmm_t3 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t3, chorba1), chorba3), chorba4), chorba5);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            xmm_t0 = _mm_loadu_si128((__m128i *)src + 28);
            xmm_t1 = _mm_loadu_si128((__m128i *)src + 29);
            xmm_t2 = _mm_loadu_si128((__m128i *)src + 30);
            xmm_t3 = _mm_loadu_si128((__m128i *)src + 31);

            fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
            _mm_storeu_si128((__m128i *)dst, xmm_t0);
            _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
            _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
            _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
            dst += 64;
#endif
            xmm_t0 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t0, chorba2), chorba3), chorba4);
            xmm_t1 = _mm_xor_si128(_mm_xor_si128(_mm_xor_si128(xmm_t1, chorba1), chorba2), chorba3);
            xmm_t2 = _mm_xor_si128(_mm_xor_si128(xmm_t2, chorba1), chorba2);
            xmm_t3 = _mm_xor_si128(xmm_t3, chorba1);
            xmm_crc0 = _mm_xor_si128(xmm_t0, xmm_crc0);
            xmm_crc1 = _mm_xor_si128(xmm_t1, xmm_crc1);
            xmm_crc2 = _mm_xor_si128(xmm_t2, xmm_crc2);
            xmm_crc3 = _mm_xor_si128(xmm_t3, xmm_crc3);

            len -= 512;
            src += 512;
        }
#endif /* WITHOUT_CHORBA */

    while (len >= 64) {
        len -= 64;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        xmm_t3 = _mm_load_si128((__m128i *)src + 3);
        src += 64;

        fold_4(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        _mm_storeu_si128((__m128i *)dst + 3, xmm_t3);
        dst += 64;
#else
        XOR_INITIAL128(xmm_t0);
#endif

        xmm_crc0 = _mm_xor_si128(xmm_crc0, xmm_t0);
        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t1);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t2);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t3);
    }

    /*
     * len = num bytes left - 64
     */
    if (len >= 48) {
        len -= 48;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        xmm_t2 = _mm_load_si128((__m128i *)src + 2);
        src += 48;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        _mm_storeu_si128((__m128i *)dst + 2, xmm_t2);
        dst += 48;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_3(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc1 = _mm_xor_si128(xmm_crc1, xmm_t0);
        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t1);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t2);
    } else if (len >= 32) {
        len -= 32;

        xmm_t0 = _mm_load_si128((__m128i *)src);
        xmm_t1 = _mm_load_si128((__m128i *)src + 1);
        src += 32;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        _mm_storeu_si128((__m128i *)dst + 1, xmm_t1);
        dst += 32;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_2(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc2 = _mm_xor_si128(xmm_crc2, xmm_t0);
        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t1);
    } else if (len >= 16) {
        len -= 16;
        xmm_t0 = _mm_load_si128((__m128i *)src);
        src += 16;
#ifdef COPY
        _mm_storeu_si128((__m128i *)dst, xmm_t0);
        dst += 16;
#else
        XOR_INITIAL128(xmm_t0);
#endif
        fold_1(&xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);

        xmm_crc3 = _mm_xor_si128(xmm_crc3, xmm_t0);
    }

partial:
    if (len) {
        memcpy(&xmm_crc_part, src, len);
#ifdef COPY
        _mm_storeu_si128((__m128i *)partial_buf, xmm_crc_part);
        memcpy(dst, partial_buf, len);
#endif
        partial_fold(len, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3, &xmm_crc_part);
    }

    crc32_fold_save((__m128i *)crc->fold, &xmm_crc0, &xmm_crc1, &xmm_crc2, &xmm_crc3);
}